

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

int __thiscall SQLite::Statement::tryReset(Statement *this)

{
  int iVar1;
  sqlite3_stmt *pStmt;
  Statement *this_local;
  
  this->mbHasRow = false;
  this->mbDone = false;
  pStmt = Ptr::operator_cast_to_sqlite3_stmt_(&this->mStmtPtr);
  iVar1 = sqlite3_reset(pStmt);
  return iVar1;
}

Assistant:

int Statement::tryReset() noexcept
{
    mbHasRow = false;
    mbDone = false;
    return sqlite3_reset(mStmtPtr);
}